

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmCommonTargetGenerator::AddModuleDefinitionFlag(cmCommonTargetGenerator *this,string *flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmLocalCommonGenerator *pcVar2;
  char *__s;
  size_t sVar3;
  string *psVar4;
  string flag;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->ModuleDefinitionFile != (cmSourceFile *)0x0) {
    this_00 = this->Makefile;
    paVar1 = &local_68.field_2;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"CMAKE_LINK_DEF_FILE_FLAG","");
    __s = cmMakefile::GetDefinition(this_00,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (__s != (char *)0x0) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      sVar3 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar3);
      pcVar2 = this->LocalGenerator;
      psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(this->ModuleDefinitionFile);
      (*(pcVar2->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xd])(local_48,pcVar2,psVar4,2);
      std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48[0]);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,flags,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddModuleDefinitionFlag(std::string& flags)
{
  if(!this->ModuleDefinitionFile)
    {
    return;
    }

  // TODO: Create a per-language flag variable.
  const char* defFileFlag =
    this->Makefile->GetDefinition("CMAKE_LINK_DEF_FILE_FLAG");
  if(!defFileFlag)
    {
    return;
    }

  // Append the flag and value.  Use ConvertToLinkReference to help
  // vs6's "cl -link" pass it to the linker.
  std::string flag = defFileFlag;
  flag += (this->LocalGenerator->ConvertToLinkReference(
             this->ModuleDefinitionFile->GetFullPath()));
  this->LocalGenerator->AppendFlags(flags, flag);
}